

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O0

PeriodicTable_p indigox::PeriodicTable::GetInstance(void)

{
  bool bVar1;
  shared_ptr<indigox::PeriodicTable> *__r;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  PeriodicTable_p PVar3;
  PeriodicTable_p *instance;
  PeriodicTable *in_stack_000002c0;
  element_type *__p;
  __shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffe0;
  
  __p = in_RDI;
  std::weak_ptr<indigox::PeriodicTable>::lock((weak_ptr<indigox::PeriodicTable> *)in_RDI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)__p);
  _Var2._M_pi = extraout_RDX;
  if (!bVar1) {
    __r = (shared_ptr<indigox::PeriodicTable> *)operator_new(0x60);
    __r[5].super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    __r[5].super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __r[4].super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    __r[4].super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __r[3].super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    __r[3].super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __r[2].super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    __r[2].super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __r[1].super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    __r[1].super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__r->super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (__r->super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    PeriodicTable(in_RDI);
    std::__shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>::
    reset<indigox::PeriodicTable>(in_stack_ffffffffffffffe0,__p);
    std::__shared_ptr_access<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x123d76);
    GeneratePeriodicTable(in_stack_000002c0);
    std::weak_ptr<indigox::PeriodicTable>::operator=((weak_ptr<indigox::PeriodicTable> *)in_RDI,__r)
    ;
    _Var2._M_pi = extraout_RDX_00;
  }
  PVar3.super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  PVar3.super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (PeriodicTable_p)
         PVar3.super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PeriodicTable_p PeriodicTable::GetInstance() {
    PeriodicTable_p instance = instance_.lock();
    if (!instance) {
      instance.reset(new PeriodicTable());
      instance->GeneratePeriodicTable();
      instance_ = instance;
    }
    return instance;
  }